

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

int ggml::cpu::aarch64::repack<block_q4_K,8l,8l>(ggml_tensor *t,void *data,size_t data_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  block_q4_K dst_tmp [8];
  block_q4_Kx8 out;
  undefined2 local_938;
  undefined2 uStack_936;
  undefined4 uStack_934;
  byte bStack_930;
  undefined7 uStack_92f;
  undefined2 uStack_928;
  undefined1 auStack_8f8 [16];
  undefined1 auStack_8e8 [64];
  ushort local_8a8;
  ushort local_8a6;
  byte local_8a4;
  byte local_8a0;
  ushort local_818;
  ushort local_816;
  byte local_814;
  byte local_810;
  ushort local_788;
  ushort local_786;
  byte local_784;
  byte local_780;
  ushort local_6f8;
  ushort local_6f6;
  byte local_6f4;
  byte local_6f0;
  ushort local_668;
  ushort local_666;
  byte local_664;
  byte local_660;
  ushort local_5d8;
  ushort local_5d6;
  byte local_5d4;
  byte local_5d0;
  ushort local_548;
  ushort local_546;
  byte local_544;
  byte local_540;
  undefined1 local_4b8 [1160];
  
  if (t->type == GGML_TYPE_Q4_K) {
    iVar3 = ggml_nrows();
    lVar4 = t->ne[0];
    lVar7 = lVar4 + 0xff;
    if (-1 < lVar4) {
      lVar7 = lVar4;
    }
    iVar5 = (int)((ulong)lVar7 >> 8);
    if ((long)(iVar3 * iVar5) * 0x90 == data_size) {
      iVar6 = -1;
      if ((((uint)lVar4 | (uint)t->ne[1]) & 7) == 0) {
        if (0 < iVar3) {
          iVar6 = 0;
          auVar10 = vpbroadcastq_avx512f(ZEXT816(7));
          auVar11 = vpbroadcastq_avx512f(ZEXT816(0x78));
          auVar12 = vpbroadcastq_avx512f();
          auVar13 = vpbroadcastq_avx512f(ZEXT816(0x90));
          auVar14 = vpbroadcastq_avx512f(ZEXT816(8));
          auVar18[8] = 0x3f;
          auVar18._0_8_ = 0x3f3f3f3f3f3f3f3f;
          auVar18[9] = 0x3f;
          auVar18[10] = 0x3f;
          auVar18[0xb] = 0x3f;
          auVar18[0xc] = 0x3f;
          auVar18[0xd] = 0x3f;
          auVar18[0xe] = 0x3f;
          auVar18[0xf] = 0x3f;
          vmovdqu64_avx512f(auVar12);
          do {
            if (0 < (long)iVar5) {
              lVar4 = 0;
              do {
                lVar7 = lVar4;
                auVar15 = vmovdqu64_avx512f(*data);
                auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + 0x40));
                auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                             (*(undefined1 (*) [64])((long)data + 0x40) + 0x10));
                auVar17 = vmovdqu64_avx512f(auVar17);
                *(undefined1 (*) [64])(auStack_8e8 + lVar7) = auVar17;
                auVar17 = vmovdqu64_avx512f(auVar16);
                *(undefined1 (*) [64])(auStack_8f8 + lVar7) = auVar17;
                auVar17 = vmovdqu64_avx512f(auVar15);
                *(undefined1 (*) [64])((long)&local_938 + lVar7) = auVar17;
                data = (void *)((long)data + (long)iVar5 * 0x90);
                lVar4 = lVar7 + 0x90;
              } while (lVar7 + 0x90 != 0x480);
              auVar2._2_2_ = uStack_936;
              auVar2._0_2_ = local_938;
              auVar2._4_4_ = uStack_934;
              auVar2[8] = bStack_930;
              auVar2._9_7_ = uStack_92f;
              auVar2 = vpinsrw_avx(auVar2,(uint)local_8a8,1);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_818,2);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_788,3);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_6f8,4);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_668,5);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_5d8,6);
              vpinsrw_avx(auVar2,(uint)local_548,7);
              auVar1._2_4_ = uStack_934;
              auVar1._0_2_ = uStack_936;
              auVar1[6] = bStack_930;
              auVar1._7_7_ = uStack_92f;
              auVar1._14_2_ = uStack_928;
              auVar2 = vpinsrw_avx(auVar1,(uint)local_8a6,1);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_816,2);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_786,3);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_6f6,4);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_666,5);
              auVar2 = vpinsrw_avx(auVar2,(uint)local_5d6,6);
              vpinsrw_avx(auVar2,(uint)local_546,7);
              lVar4 = 0x10;
              auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              do {
                auVar15 = vpandq_avx512f(auVar17,auVar10);
                auVar15 = vpmuldq_avx512f(auVar15,auVar13);
                auVar16 = vpandq_avx512f(auVar17,auVar11);
                auVar16 = vpaddq_avx512f(auVar12,auVar16);
                vpaddq_avx512f(auVar16,auVar15);
                auVar15 = vpgatherqq_avx512f(*(undefined8 *)(lVar7 + 0xa0));
                auVar15 = vmovdqu64_avx512f(auVar15);
                *(undefined1 (*) [64])(local_4b8 + lVar4 * 8) = auVar15;
                auVar17 = vpaddq_avx512f(auVar17,auVar14);
                lVar4 = lVar4 + 8;
              } while (lVar4 != 0x90);
              auVar2 = vpinsrb_avx(ZEXT116((byte)uStack_934),(uint)local_8a4,1);
              auVar2 = vpinsrb_avx(auVar2,(uint)local_814,2);
              auVar2 = vpinsrb_avx(auVar2,(uint)local_784,3);
              auVar2 = vpinsrb_avx(auVar2,(uint)local_6f4,4);
              auVar2 = vpinsrb_avx(auVar2,(uint)local_664,5);
              auVar2 = vpinsrb_avx(auVar2,(uint)local_5d4,6);
              auVar2 = vpinsrb_avx(auVar2,(uint)local_544,7);
              auVar2 = vpand_avx(auVar18,auVar2);
              auVar1 = vpinsrb_avx(ZEXT116(bStack_930),(uint)local_8a0,1);
              auVar1 = vpinsrb_avx(auVar1,(uint)local_810,2);
              auVar1 = vpinsrb_avx(auVar1,(uint)local_780,3);
              auVar1 = vpinsrb_avx(auVar1,(uint)local_6f0,4);
              auVar1 = vpinsrb_avx(auVar1,(uint)local_660,5);
              auVar1 = vpinsrb_avx(auVar1,(uint)local_5d0,6);
              auVar1 = vpinsrb_avx(auVar1,(uint)local_540,7);
              auVar18 = vpand_avx(auVar18,auVar1);
              vpunpckldq_avx(auVar2,auVar18);
              auVar2 = vpshufd_avx(auVar2,0x55);
              auVar18 = vpshufd_avx(auVar18,0x55);
              vpunpckldq_avx(auVar2,auVar18);
              halt_baddata();
            }
            iVar6 = iVar6 + 8;
            data = (void *)((long)data + (long)(iVar5 * 8) * 0x90);
          } while (iVar6 < iVar3);
        }
        iVar6 = 0;
      }
      return iVar6;
    }
    pcVar8 = "data_size == nrow * nblocks * sizeof(block_q4_K)";
    uVar9 = 0x16cc;
  }
  else {
    pcVar8 = "t->type == GGML_TYPE_Q4_K";
    uVar9 = 0x16c2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar9,"GGML_ASSERT(%s) failed",pcVar8);
}

Assistant:

static int repack_q4_K_to_q4_K_8_bl(struct ggml_tensor * t, int interleave_block, const void * GGML_RESTRICT data, size_t data_size) {
    GGML_ASSERT(t->type == GGML_TYPE_Q4_K);
    GGML_ASSERT(interleave_block == 8);
    constexpr int nrows_interleaved = 8;

    block_q4_Kx8 * dst = (block_q4_Kx8*)t->data;
    const block_q4_K * src = (const block_q4_K*) data;
    block_q4_K dst_tmp[8];
    int nrow = ggml_nrows(t);
    int nblocks = t->ne[0] / QK_K;

    GGML_ASSERT(data_size == nrow * nblocks * sizeof(block_q4_K));

    if (t->ne[1] % nrows_interleaved != 0 || t->ne[0] % 8 != 0) {
        return -1;
    }

    for (int b = 0; b < nrow; b += nrows_interleaved) {
        for (int64_t x = 0; x < nblocks; x++) {
            for (int i  = 0; i < nrows_interleaved; i++ ) {
                dst_tmp[i] = src[x + i * nblocks];
            }
            *dst++ = make_block_q4_Kx8(dst_tmp, interleave_block);
        }
        src += nrows_interleaved * nblocks;
    }
    return 0;

    GGML_UNUSED(data_size);
}